

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall
GlobOptBlockData::MergeValueMaps
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  SymID SVar1;
  Loop *pLVar2;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  GlobHashTable *pGVar3;
  GlobHashTable *pGVar4;
  Value *toDataValue;
  Value *fromDataValue;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar5;
  FlowEdge **this_02;
  NodeBase *pNVar6;
  bool bVar7;
  bool bVar8;
  BOOLEAN BVar9;
  int iVar10;
  ValueNumber i_00;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  Type_conflict pSVar14;
  Type *pTVar15;
  Value **ppVVar16;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_03;
  Type *ppFVar17;
  BasicBlock *this_04;
  bool bVar18;
  Iterator IVar19;
  bool local_205;
  bool local_181;
  BasicBlock *pred;
  FlowEdge **__edge;
  Iterator __iter;
  BasicBlock *lastBlock;
  bool isLastLoopBackEdge;
  Value *pVStack_150;
  Value *previouslyMergedValue;
  Value *pVStack_140;
  bool forceUniqueValue;
  Value *newValue;
  GlobHashBucket *bucket;
  EditingIterator iter;
  Iterator iter2;
  uint i;
  GlobHashTable *otherTable;
  GlobHashTable *thisTable;
  BVSparse<Memory::JitArenaAllocator> *mergedValueTypesTrackedForKills;
  ValueSetByValueNumber mergedValues;
  bool isLoopPrepass;
  Loop *loop;
  bool isLoopBackEdge;
  GlobOptBlockData *fromData;
  BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge_local;
  BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation_local;
  BasicBlock *fromBlock_local;
  BasicBlock *toBlock_local;
  GlobOptBlockData *this_local;
  
  bVar18 = (*(ushort *)&toBlock->field_0x18 >> 2 & 1) != 0;
  pLVar2 = toBlock->loop;
  local_181 = false;
  if (pLVar2 != (Loop *)0x0) {
    local_181 = this->globOpt->prePassLoop == pLVar2;
  }
  mergedValues.
  super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats._7_1_ = local_181;
  iVar10 = JsUtil::
           BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Count(this->globOpt->valuesCreatedForMerge);
  if (iVar10 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x2eb,"(this->globOpt->valuesCreatedForMerge->Count() == 0)",
                       "this->globOpt->valuesCreatedForMerge->Count() == 0");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)&mergedValueTypesTrackedForKills,this->globOpt->tempAlloc,0x40);
  this_00 = this->globOpt->tempBv;
  bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this_00);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x2ef,"(mergedValueTypesTrackedForKills->IsEmpty())",
                       "mergedValueTypesTrackedForKills->IsEmpty()");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(this->valuesToKillOnCalls);
  pGVar3 = this->symToValueMap;
  pGVar4 = (fromBlock->globOptData).symToValueMap;
  iter2.current._4_4_ = 0;
  do {
    if (pGVar3->tableSize <= iter2.current._4_4_) {
      JsUtil::
      BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear(this->globOpt->valuesCreatedForMerge);
      JsUtil::
      BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Reset((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)&mergedValueTypesTrackedForKills);
      BVSparse<Memory::JitArenaAllocator>::ClearAll(this_00);
      ValueHashTable<ExprHash,_Value_*>::And
                (this->exprToValueMap,(fromBlock->globOptData).exprToValueMap);
      GlobOpt::ProcessValueKills(this->globOpt,toBlock,this);
      lastBlock._3_1_ = false;
      if (bVar18) {
        GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(this->globOpt,toBlock,this);
        __iter.current = (NodeBase *)0x0;
        this_03 = &BasicBlock::GetPredList(toBlock)->
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        IVar19 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_03);
        while( true ) {
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IVar19.current;
          __edge = (FlowEdge **)IVar19.list;
          if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar18 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar18) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            IVar19.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
            IVar19.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)__edge;
            *puVar13 = 0;
          }
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IVar19.current;
          __edge = (FlowEdge **)IVar19.list;
          this_02 = __edge;
          pSVar14 = SListNodeBase<Memory::ArenaAllocator>::Next
                              ((SListNodeBase<Memory::ArenaAllocator> *)__iter.list);
          bVar18 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                             ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_02,
                              pSVar14);
          if (bVar18) break;
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                        SListNodeBase<Memory::ArenaAllocator>::Next
                                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          ppFVar17 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)&__edge);
          this_04 = FlowEdge::GetPred(*ppFVar17);
          if (this_04 == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar18 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                ,0x34e,"(pred)","pred");
            if (!bVar18) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
          if (__iter.current != (NodeBase *)0x0) {
            uVar11 = BasicBlock::GetBlockNum(this_04);
            uVar12 = BasicBlock::GetBlockNum((BasicBlock *)__iter.current);
            if (uVar11 <= uVar12) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar18 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                  ,0x350,
                                  "(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum())",
                                  "!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum()");
              if (!bVar18) {
                pcVar5 = (code *)invalidInstructionException();
                (*pcVar5)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
          }
          IVar19.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
          IVar19.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)__edge;
          __iter.current = (NodeBase *)this_04;
        }
        __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        lastBlock._3_1_ = (BasicBlock *)__iter.current == fromBlock;
      }
      JsUtil::
      BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::~BaseHashSet((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      *)&mergedValueTypesTrackedForKills);
      return;
    }
    SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&iter.last,pGVar4->table + iter2.current._4_4_);
    if (iter2.list ==
        (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 0;
    }
    pNVar6 = iter.last;
    pSVar14 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar7 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       pNVar6,pSVar14);
    if (bVar7) {
      iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    else {
      iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   SListNodeBase<Memory::ArenaAllocator>::Next
                             (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&bucket,pGVar3->table + iter2.current._4_4_);
    while (bVar7 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::Next((EditingIterator *)&bucket), bVar7) {
      newValue = (Value *)SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                          Iterator::Data((Iterator *)&bucket);
      while( true ) {
        bVar8 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
                IsValid((Iterator *)&iter.last);
        bVar7 = false;
        if (bVar8) {
          uVar11 = *(uint *)&newValue->valueInfo->symStore;
          pTVar15 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)&iter.last);
          bVar7 = uVar11 < pTVar15->value->m_id;
        }
        if (!bVar7) break;
        if (iter2.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pNVar6 = iter.last;
        pSVar14 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar7 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar6,pSVar14);
        if (bVar7) {
          iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
        }
        else {
          iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       SListNodeBase<Memory::ArenaAllocator>::Next
                                 (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      pVStack_140 = (Value *)0x0;
      bVar7 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
              IsValid((Iterator *)&iter.last);
      if ((bVar7) &&
         (SVar1 = *(SymID *)&newValue->valueInfo->symStore,
         pTVar15 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)&iter.last), SVar1 == pTVar15->value->m_id)) {
        local_205 = false;
        if (bVar18) {
          bVar7 = GlobOpt::IsLoopPrePass(this->globOpt);
          local_205 = false;
          if ((!bVar7) && (local_205 = false, pLVar2 != (Loop *)0x0)) {
            BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                              (pLVar2->symsAssignedToInLoop,
                               *(BVIndex *)&newValue->valueInfo->symStore);
            local_205 = BVar9 != '\0';
          }
        }
        previouslyMergedValue._7_1_ = local_205;
        toDataValue = *(Value **)newValue;
        pTVar15 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)&iter.last);
        fromDataValue = pTVar15->element;
        pTVar15 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)&iter.last);
        pVStack_140 = MergeValues(this,toDataValue,fromDataValue,pTVar15->value,bVar18,
                                  (bool)(previouslyMergedValue._7_1_ & 1),symsRequiringCompensation,
                                  symsCreatedForMerge);
      }
      if (pVStack_140 == (Value *)0x0) {
        SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)&bucket,&pGVar3->alloc->super_ArenaAllocator);
      }
      else {
        lastBlock._4_4_ = ::Value::GetValueNumber(pVStack_140);
        ppVVar16 = JsUtil::
                   BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::Lookup((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)&mergedValueTypesTrackedForKills,(uint *)((long)&lastBlock + 4));
        pVStack_150 = *ppVVar16;
        if (pVStack_150 == (Value *)0x0) {
          JsUtil::
          BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Add((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)&mergedValueTypesTrackedForKills,&stack0xfffffffffffffec0);
        }
        else {
          this_01 = this->globOpt->byteCodeConstantValueNumbersBv;
          i_00 = ::Value::GetValueNumber(pVStack_140);
          BVar9 = BVSparse<Memory::JitArenaAllocator>::Test(this_01,i_00);
          if ((BVar9 == '\0') && (pVStack_140 != pVStack_150)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                               ,0x326,"(newValue == previouslyMergedValue)",
                               "newValue == previouslyMergedValue");
            if (!bVar7) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar13 = 0;
          }
        }
        GlobOpt::TrackMergedValueForKills(this->globOpt,pVStack_140,this,this_00);
        *(Value **)newValue = pVStack_140;
        if (iter2.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pNVar6 = iter.last;
        pSVar14 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar7 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar6,pSVar14);
        if (bVar7) {
          iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
        }
        else {
          iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       SListNodeBase<Memory::ArenaAllocator>::Next
                                 (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
    }
    if (((mergedValues.
          super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          .stats._7_1_ & 1) != 0) &&
       ((*(ushort *)&this->globOpt->rootLoopPrePass->field_0x178 >> 7 & 1) == 0)) {
      while (bVar7 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::IsValid((Iterator *)&iter.last), bVar7) {
        if (iter2.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pNVar6 = iter.last;
        pSVar14 = SListNodeBase<Memory::ArenaAllocator>::Next
                            (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar7 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar6,pSVar14);
        if (bVar7) {
          iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       0x0;
        }
        else {
          iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                       SListNodeBase<Memory::ArenaAllocator>::Next
                                 (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
    }
    iter2.current._4_4_ = iter2.current._4_4_ + 1;
  } while( true );
}

Assistant:

void
GlobOptBlockData::MergeValueMaps(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);
    bool isLoopBackEdge = toBlock->isLoopHeader;
    Loop *loop = toBlock->loop;
    bool isLoopPrepass = (loop && this->globOpt->prePassLoop == loop);

    Assert(this->globOpt->valuesCreatedForMerge->Count() == 0);
    DebugOnly(ValueSetByValueNumber mergedValues(this->globOpt->tempAlloc, 64));

    BVSparse<JitArenaAllocator> *const mergedValueTypesTrackedForKills = this->globOpt->tempBv;
    Assert(mergedValueTypesTrackedForKills->IsEmpty());
    this->valuesToKillOnCalls->Clear(); // the tracking will be reevaluated based on merged value types

    GlobHashTable *thisTable = this->symToValueMap;
    GlobHashTable *otherTable = fromData->symToValueMap;
    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        SListBase<GlobHashBucket>::Iterator iter2(&otherTable->table[i]);
        iter2.Next();
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            while (iter2.IsValid() && bucket.value->m_id < iter2.Data().value->m_id)
            {
                iter2.Next();
            }
            Value *newValue = nullptr;

            if (iter2.IsValid() && bucket.value->m_id == iter2.Data().value->m_id)
            {
                // Syms that are assigned to within the loop must have unique
                // value numbers in the loop header after merging; a single
                // prepass is not adequate to determine that sym values are
                // equivalent through all possible loop paths.
                bool forceUniqueValue =
                    isLoopBackEdge &&
                    !this->globOpt->IsLoopPrePass() &&
                    loop &&
                    loop->symsAssignedToInLoop->Test(bucket.value->m_id);

                newValue =
                    this->MergeValues(
                        bucket.element,
                        iter2.Data().element,
                        iter2.Data().value,
                        isLoopBackEdge,
                        forceUniqueValue,
                        symsRequiringCompensation,
                        symsCreatedForMerge);
            }
            if (newValue == nullptr)
            {
                iter.RemoveCurrent(thisTable->alloc);
                continue;
            }
            else
            {
#if DBG
                // Ensure that only one value per value number is produced by merge. Byte-code constant values are reused in
                // multiple blocks without cloning, so exclude those value numbers.
                {
                    Value *const previouslyMergedValue = mergedValues.Lookup(newValue->GetValueNumber());
                    if (previouslyMergedValue)
                    {
                        if (!this->globOpt->byteCodeConstantValueNumbersBv->Test(newValue->GetValueNumber()))
                        {
                            Assert(newValue == previouslyMergedValue);
                        }
                    }
                    else
                    {
                        mergedValues.Add(newValue);
                    }
                }
#endif

                this->globOpt->TrackMergedValueForKills(newValue, this, mergedValueTypesTrackedForKills);
                bucket.element = newValue;
            }
            iter2.Next();
        } NEXT_SLISTBASE_ENTRY_EDITING;

        if (isLoopPrepass && !this->globOpt->rootLoopPrePass->allFieldsKilled)
        {
            while (iter2.IsValid())
            {
                iter2.Next();
            }
        }
    }

    this->globOpt->valuesCreatedForMerge->Clear();
    DebugOnly(mergedValues.Reset());
    mergedValueTypesTrackedForKills->ClearAll();

    this->exprToValueMap->And(fromData->exprToValueMap);

    this->globOpt->ProcessValueKills(toBlock, this);

    bool isLastLoopBackEdge = false;

    if (isLoopBackEdge)
    {
        this->globOpt->ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(toBlock, this);

        BasicBlock *lastBlock = nullptr;
        FOREACH_PREDECESSOR_BLOCK(pred, toBlock)
        {
            Assert(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum());
            lastBlock = pred;
        }NEXT_PREDECESSOR_BLOCK;
        isLastLoopBackEdge = (lastBlock == fromBlock);
    }
}